

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int bam_plp_push(bam_plp_t iter,bam1_t *b)

{
  int iVar1;
  uint64_t uVar2;
  int iVar3;
  lbnode_t *plVar4;
  bam1_t *b_local;
  bam_plp_t iter_local;
  
  if (iter->error != 0) {
    return -1;
  }
  if (b == (bam1_t *)0x0) {
    iter->is_eof = 1;
  }
  else {
    if ((b->core).tid < 0) {
      overlap_remove(iter,b);
      return 0;
    }
    if ((*(ulong *)&(b->core).field_0x8 & 0x400000000) != 0) {
      overlap_remove(iter,b);
      return 0;
    }
    if (((iter->tid == (b->core).tid) && (iter->pos == (b->core).pos)) &&
       (iter->maxcnt < iter->mp->cnt)) {
      overlap_remove(iter,b);
      return 0;
    }
    bam_copy1(&iter->tail->b,b);
    overlap_push(iter,iter->tail);
    uVar2 = iter->id;
    iter->id = uVar2 + 1;
    (iter->tail->b).id = uVar2;
    iter->tail->beg = (b->core).pos;
    iVar1 = (b->core).pos;
    iVar3 = bam_cigar2rlen((uint)(ushort)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x30),
                           (uint32_t *)
                           (b->data +
                           (int)((uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x18) & 0xff))
                          );
    iter->tail->end = iVar1 + iVar3;
    plVar4 = iter->tail;
    iVar1 = g_cstate_null.x;
    (plVar4->s).k = g_cstate_null.k;
    (plVar4->s).x = iVar1;
    iVar1 = g_cstate_null.end;
    (plVar4->s).y = g_cstate_null.y;
    (plVar4->s).end = iVar1;
    (iter->tail->s).end = iter->tail->end + -1;
    if ((b->core).tid < iter->max_tid) {
      fprintf(_stderr,"[bam_pileup_core] the input is not sorted (chromosomes out of order)\n");
      iter->error = 1;
      return -1;
    }
    if (((b->core).tid == iter->max_tid) && (iter->tail->beg < iter->max_pos)) {
      fprintf(_stderr,"[bam_pileup_core] the input is not sorted (reads out of order)\n");
      iter->error = 1;
      return -1;
    }
    iter->max_tid = (b->core).tid;
    iter->max_pos = iter->tail->beg;
    if ((iter->pos < iter->tail->end) || (iter->tid < (iter->tail->b).core.tid)) {
      plVar4 = mp_alloc(iter->mp);
      iter->tail->next = plVar4;
      iter->tail = iter->tail->next;
    }
  }
  return 0;
}

Assistant:

int bam_plp_push(bam_plp_t iter, const bam1_t *b)
{
    if (iter->error) return -1;
    if (b) {
        if (b->core.tid < 0) { overlap_remove(iter, b); return 0; }
        // Skip only unmapped reads here, any additional filtering must be done in iter->func
        if (b->core.flag & BAM_FUNMAP) { overlap_remove(iter, b); return 0; }
        if (iter->tid == b->core.tid && iter->pos == b->core.pos && iter->mp->cnt > iter->maxcnt)
        {
            overlap_remove(iter, b);
            return 0;
        }
        bam_copy1(&iter->tail->b, b);
        overlap_push(iter, iter->tail);
#ifndef BAM_NO_ID
        iter->tail->b.id = iter->id++;
#endif
        iter->tail->beg = b->core.pos;
        iter->tail->end = b->core.pos + bam_cigar2rlen(b->core.n_cigar, bam_get_cigar(b));
        iter->tail->s = g_cstate_null; iter->tail->s.end = iter->tail->end - 1; // initialize cstate_t
        if (b->core.tid < iter->max_tid) {
            fprintf(stderr, "[bam_pileup_core] the input is not sorted (chromosomes out of order)\n");
            iter->error = 1;
            return -1;
        }
        if ((b->core.tid == iter->max_tid) && (iter->tail->beg < iter->max_pos)) {
            fprintf(stderr, "[bam_pileup_core] the input is not sorted (reads out of order)\n");
            iter->error = 1;
            return -1;
        }
        iter->max_tid = b->core.tid; iter->max_pos = iter->tail->beg;
        if (iter->tail->end > iter->pos || iter->tail->b.core.tid > iter->tid) {
            iter->tail->next = mp_alloc(iter->mp);
            iter->tail = iter->tail->next;
        }
    } else iter->is_eof = 1;
    return 0;
}